

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_minVal(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  undefined4 *in_RCX;
  CVmObjVector *in_RDX;
  vm_rcdesc *in_RDI;
  int unaff_retaddr;
  vm_rcdesc rc;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  unsigned_short in_stack_ffffffffffffff72;
  vm_obj_id_t in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar2;
  int in_stack_ffffffffffffffc4;
  vm_rcdesc *in_stack_ffffffffffffffc8;
  uint *in_stack_ffffffffffffffd0;
  vm_val_t *in_stack_ffffffffffffffd8;
  
  CVmStack::get(0);
  if (in_RCX == (undefined4 *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *in_RCX;
  }
  vm_rcdesc::vm_rcdesc
            (in_RDI,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff78),in_stack_ffffffffffffff74,
             in_stack_ffffffffffffff72,
             (vm_val_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  iVar1 = get_minmax(in_RDX,(vm_obj_id_t)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd8,
                     in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                     unaff_retaddr);
  return iVar1;
}

Assistant:

int CVmObjVector::getp_minVal(VMG_ vm_obj_id_t self,
                              vm_val_t *retval, uint *argc)
{
    /* do the general calculation to select the minimum value ("-1") */
    vm_rcdesc rc(vmg_ "Vector.minVal", self, 33, G_stk->get(0),
                 argc != 0 ? *argc : 0);
    return get_minmax(vmg_ self, retval, argc, &rc, -1, FALSE);
}